

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

void __thiscall
CVmObjTable::init_entry_for_alloc
          (CVmObjTable *this,vm_obj_id_t id,CVmObjPageEntry *entry,int in_root_set,int can_have_refs
          ,int can_have_weak_refs)

{
  int in_ECX;
  CVmObjPageEntry *in_RDX;
  vm_obj_id_t in_ESI;
  CVmObjTable *in_RDI;
  ushort in_R8W;
  ushort in_R9W;
  
  *(ushort *)&in_RDX->field_0x14 = *(ushort *)&in_RDX->field_0x14 & 0xfffe;
  *(ushort *)&in_RDX->field_0x14 = *(ushort *)&in_RDX->field_0x14 & 0xffbf;
  *(ushort *)&in_RDX->field_0x14 =
       *(ushort *)&in_RDX->field_0x14 & 0xfffd | ((ushort)in_ECX & 1) << 1;
  *(ushort *)&in_RDX->field_0x14 = *(ushort *)&in_RDX->field_0x14 & 0xff7f;
  *(ushort *)&in_RDX->field_0x14 = *(ushort *)&in_RDX->field_0x14 & 0xfeff;
  *(ushort *)&in_RDX->field_0x14 = *(ushort *)&in_RDX->field_0x14 & 0xfdff | (in_R8W & 1) << 9;
  *(ushort *)&in_RDX->field_0x14 = *(ushort *)&in_RDX->field_0x14 & 0xfbff | (in_R9W & 1) << 10;
  *(ushort *)&in_RDX->field_0x14 = *(ushort *)&in_RDX->field_0x14 & 0xfff3;
  *(ushort *)&in_RDX->field_0x14 = *(ushort *)&in_RDX->field_0x14 & 0xffcf;
  if (in_ECX != 0) {
    add_to_gc_queue(in_RDI,in_ESI,in_RDX,2);
  }
  return;
}

Assistant:

void CVmObjTable::init_entry_for_alloc(vm_obj_id_t id,
                                       CVmObjPageEntry *entry,
                                       int in_root_set,
                                       int can_have_refs,
                                       int can_have_weak_refs)
{
    /* mark the entry as in use */
    entry->free_ = FALSE;

    /* no undo savepoint has been created since the object was created */
    entry->in_undo_ = FALSE;

    /* mark the object as being in the root set if appropriate */
    entry->in_root_set_ = in_root_set;

    /* presume it's an ordinary persistent object */
    entry->transient_ = FALSE;

    /* presume it won't need post-load initialization */
    entry->requested_post_load_init_ = FALSE;

    /* set the GC characteristics as requested */
    entry->can_have_refs_ = can_have_refs;
    entry->can_have_weak_refs_ = can_have_weak_refs;

    /* 
     *   Mark the object as initially unreachable and unfinalizable.  It's
     *   not necessarily really unreachable at this point, but we mark it
     *   as such because the garbage collector hasn't explicitly traced
     *   the object to be reachable.  The initial conditions for garbage
     *   collection are that all objects not in the root set and not
     *   finalizable are marked as unreachable; since we're not in a gc
     *   pass right now (we can't be - memory cannot be allocated during a
     *   gc pass), we know that we must establish initial gc conditions
     *   for the next time we start a gc pass.  
     */
    entry->reachable_ = VMOBJ_UNREACHABLE;
    entry->finalize_state_ = VMOBJ_UNFINALIZABLE;

    /* add it to the GC work queue for the next GC pass */
    if (in_root_set)
        add_to_gc_queue(id, entry, VMOBJ_REACHABLE);
}